

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

int __thiscall
cmCTestSubmitHandler::HandleCDashUploadFile
          (cmCTestSubmitHandler *this,string *file,string *typeString)

{
  cmCTestCurl *this_00;
  cmCTest *pcVar1;
  string_view sVar2;
  bool bVar3;
  Int IVar4;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  string *psVar8;
  cmCTestScriptHandler *this_01;
  cmState *this_02;
  rep rVar9;
  void *pvVar10;
  Value *pVVar11;
  string local_2998 [32];
  undefined1 local_2978 [8];
  ostringstream cmCTestLog_msg_18;
  string local_2800 [32];
  String local_27e0;
  undefined1 local_27c0 [8];
  ostringstream cmCTestLog_msg_17;
  string local_2648 [32];
  string local_2628 [32];
  undefined1 local_2608 [8];
  ostringstream cmCTestLog_msg_16;
  string local_2490;
  string local_2470 [32];
  undefined1 local_2450 [8];
  ostringstream cmCTestLog_msg_15;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_22d8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_22d0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_22c8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop_1;
  undefined1 local_22a0 [8];
  ostringstream cmCTestLog_msg_14;
  ulong local_2128;
  unsigned_long i_1;
  byte local_20f9;
  undefined1 local_20f8 [7];
  bool uploadSucceeded;
  string local_20d8;
  string local_20b8;
  undefined1 local_2098 [8];
  ostringstream fstr;
  undefined1 local_1f20 [8];
  string upload_as;
  undefined1 local_1ee0 [8];
  ostringstream cmCTestLog_msg_13;
  string local_1d68 [32];
  undefined1 local_1d48 [8];
  ostringstream cmCTestLog_msg_12;
  string local_1bc8 [4];
  int datares;
  undefined1 local_1ba8 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1a30 [32];
  String local_1a10;
  undefined1 local_19f0 [8];
  ostringstream cmCTestLog_msg_10;
  undefined1 local_1878 [8];
  Reader reader;
  Value json;
  undefined1 local_1720 [8];
  ostringstream cmCTestLog_msg_9;
  string local_15a8 [32];
  undefined1 local_1588 [8];
  ostringstream cmCTestLog_msg_8;
  string local_1410 [32];
  undefined1 local_13f0 [8];
  ostringstream cmCTestLog_msg_7;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1278;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1270;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1268;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop;
  undefined1 local_1240 [8];
  ostringstream cmCTestLog_msg_6;
  ulong local_10c8;
  unsigned_long i;
  undefined1 local_10b8 [7];
  bool requestSucceeded;
  string response;
  undefined1 local_1078 [8];
  ostringstream cmCTestLog_msg_5;
  string local_f00 [32];
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  allocator<char> local_e39;
  string local_e38;
  string local_e18;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  time_point local_cb0;
  time_t local_ca8;
  time_t timeNow;
  undefined1 local_c80 [8];
  ostringstream str;
  allocator<char> local_b01;
  string local_b00;
  cmValue local_ae0;
  cmValue subproject;
  cmake *cm;
  cmCTestScriptHandler *ch;
  string md5sum;
  undefined1 local_a88 [8];
  ostringstream cmCTestLog_msg_4;
  unsigned_long local_910;
  unsigned_long retryCount;
  string local_900 [32];
  undefined1 local_8e0 [8];
  ostringstream cmCTestLog_msg_3;
  unsigned_long local_768;
  unsigned_long retryDelayValue;
  seconds retryDelay;
  string local_750;
  cmValue local_730;
  undefined1 local_728 [8];
  string retryCountString;
  string local_700;
  cmValue local_6e0;
  undefined1 local_6d8 [8];
  string retryDelayString;
  string local_6b0;
  string *local_690;
  byte local_681;
  string local_680 [7];
  bool internalTest;
  ulong local_660;
  size_type pos;
  string fields;
  string local_630 [32];
  undefined1 local_610 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_478 [8];
  string url;
  int submitInactivityTimeout;
  undefined1 local_440 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_420;
  undefined1 local_400 [8];
  string curlopt;
  cmCTestCurl curl;
  ostringstream local_348 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  string *typeString_local;
  string *file_local;
  cmCTestSubmitHandler *this_local;
  
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"Upload file not specified\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1ed,pcVar7,false);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return -1;
  }
  bVar3 = cmsys::SystemTools::FileExists(file);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_348);
    poVar6 = std::operator<<((ostream *)local_348,"Upload file not found: \'");
    poVar6 = std::operator<<(poVar6,(string *)file);
    std::operator<<(poVar6,"\'\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1f2,pcVar7,false);
    std::__cxx11::string::~string((string *)&curl.TimeOutSeconds);
    std::__cxx11::ostringstream::~ostringstream(local_348);
    return -1;
  }
  this_00 = (cmCTestCurl *)((long)&curlopt.field_2 + 8);
  cmCTestCurl::cmCTestCurl(this_00,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::SetQuiet(this_00,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"CurlOptions",
             (allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmCTest::GetCTestConfiguration((string *)local_400,pcVar1,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_400)
  ;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_440,sVar2,false);
  cmCTestCurl::SetCurlOptions
            ((cmCTestCurl *)((long)&curlopt.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_440);
  url.field_2._12_4_ = GetSubmitInactivityTimeout(this);
  if (url.field_2._12_4_ != 0) {
    cmCTestCurl::SetTimeOutSeconds((cmCTestCurl *)((long)&curlopt.field_2 + 8),url.field_2._12_4_);
  }
  cmCTestCurl::SetHttpHeaders((cmCTestCurl *)((long)&curlopt.field_2 + 8),&this->HttpHeaders);
  cmCTest::GetSubmitURL_abi_cxx11_((string *)local_478,(this->super_cmCTestGenericHandler).CTest);
  sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_478)
  ;
  bVar3 = cmHasLiteralPrefix<8ul>(sVar2,(char (*) [8])"http://");
  if (!bVar3) {
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_478);
    bVar3 = cmHasLiteralPrefix<9ul>(sVar2,(char (*) [9])"https://");
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      std::operator<<((ostream *)local_610,"Only http and https are supported for CDASH_UPLOAD\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x203,pcVar7,false);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
      this_local._4_4_ = -1;
      fields.field_2._12_4_ = 1;
      goto LAB_00285d17;
    }
  }
  std::__cxx11::string::string((string *)&pos);
  local_660 = std::__cxx11::string::find((char)local_478,0x3f);
  if (local_660 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_680,(ulong)local_478);
    std::__cxx11::string::operator=((string *)&pos,local_680);
    std::__cxx11::string::~string(local_680);
    std::__cxx11::string::erase((ulong)local_478,local_660);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"InternalTest",
             (allocator<char> *)(retryDelayString.field_2._M_local_buf + 0xf));
  local_690 = (string *)
              cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_6b0);
  bVar3 = cmIsOn((cmValue)local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)(retryDelayString.field_2._M_local_buf + 0xf))
  ;
  local_681 = bVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_700,"RetryDelay",
             (allocator<char> *)(retryCountString.field_2._M_local_buf + 0xf));
  local_6e0 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_700);
  psVar8 = cmValue::operator*[abi_cxx11_(&local_6e0);
  std::__cxx11::string::string((string *)local_6d8,(string *)psVar8);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator((allocator<char> *)(retryCountString.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"RetryCount",(allocator<char> *)((long)&retryDelay.__r + 7));
  local_730 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_750);
  psVar8 = cmValue::operator*[abi_cxx11_(&local_730);
  std::__cxx11::string::string((string *)local_728,(string *)psVar8);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)((long)&retryDelay.__r + 7));
  memset(&retryDelayValue,0,8);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    local_768 = 0;
    bVar3 = cmStrToULong((string *)local_6d8,&local_768);
    if (bVar3) {
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
                ((duration<long,std::ratio<1l,1l>> *)&retryCount,&local_768);
      retryDelayValue = retryCount;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8e0);
      poVar6 = std::operator<<((ostream *)local_8e0,"Invalid value for \'RETRY_DELAY\' : ");
      poVar6 = std::operator<<(poVar6,(string *)local_6d8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x218,pcVar7,false);
      std::__cxx11::string::~string(local_900);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8e0);
    }
  }
  local_910 = 0;
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) == 0) && (bVar3 = cmStrToULong((string *)local_728,&local_910), !bVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a88);
    poVar6 = std::operator<<((ostream *)local_a88,"Invalid value for \'RETRY_DELAY\' : ");
    poVar6 = std::operator<<(poVar6,(string *)local_728);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x222,pcVar7,false);
    std::__cxx11::string::~string((string *)(md5sum.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a88);
  }
  cmSystemTools::ComputeFileHash((string *)&ch,file,AlgoMD5);
  this_01 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
  subproject.Value = (string *)cmCTestScriptHandler::GetCMake(this_01);
  this_02 = cmake::GetState((cmake *)subproject.Value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b00,"SubProject",&local_b01);
  local_ae0 = cmState::GetGlobalProperty(this_02,&local_b00);
  std::__cxx11::string::~string((string *)&local_b00);
  std::allocator<char>::~allocator(&local_b01);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c80);
  bVar3 = cmValue::operator_cast_to_bool(&local_ae0);
  if (bVar3) {
    poVar6 = std::operator<<((ostream *)local_c80,"subproject=");
    psVar8 = cmValue::operator*[abi_cxx11_(&local_ae0);
    cmCTestCurl::Escape((string *)&timeNow,(cmCTestCurl *)((long)&curlopt.field_2 + 8),psVar8);
    poVar6 = std::operator<<(poVar6,(string *)&timeNow);
    std::operator<<(poVar6,"&");
    std::__cxx11::string::~string((string *)&timeNow);
  }
  local_cb0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_ca8 = std::chrono::_V2::system_clock::to_time_t(&local_cb0);
  poVar6 = std::operator<<((ostream *)local_c80,"stamp=");
  cmCTest::GetCurrentTag_abi_cxx11_(&local_cf0,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_cd0,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_cf0);
  poVar6 = std::operator<<(poVar6,(string *)&local_cd0);
  poVar6 = std::operator<<(poVar6,"-");
  cmCTest::GetTestModelString_abi_cxx11_(&local_d30,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_d10,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_d30);
  poVar6 = std::operator<<(poVar6,(string *)&local_d10);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"model=");
  cmCTest::GetTestModelString_abi_cxx11_(&local_d70,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_d50,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_d70);
  poVar6 = std::operator<<(poVar6,(string *)&local_d50);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"build=");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd0,"BuildName",&local_dd1);
  cmCTest::GetCTestConfiguration(&local_db0,pcVar1,&local_dd0);
  cmCTestCurl::Escape(&local_d90,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_db0);
  poVar6 = std::operator<<(poVar6,(string *)&local_d90);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"site=");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e38,"Site",&local_e39);
  cmCTest::GetCTestConfiguration(&local_e18,pcVar1,&local_e38);
  cmCTestCurl::Escape(&local_df8,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_e18);
  poVar6 = std::operator<<(poVar6,(string *)&local_df8);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"group=");
  cmCTest::GetTestModelString_abi_cxx11_(&local_e80,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_e60,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_e80);
  poVar6 = std::operator<<(poVar6,(string *)&local_e60);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"track=");
  cmCTest::GetTestModelString_abi_cxx11_(&local_ec0,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_ea0,(cmCTestCurl *)((long)&curlopt.field_2 + 8),&local_ec0);
  poVar6 = std::operator<<(poVar6,(string *)&local_ea0);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"starttime=");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_ca8);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"endtime=");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_ca8);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"datafilesmd5[0]=");
  poVar6 = std::operator<<(poVar6,(string *)&ch);
  poVar6 = std::operator<<(poVar6,"&");
  poVar6 = std::operator<<(poVar6,"type=");
  cmCTestCurl::Escape(&local_ee0,(cmCTestCurl *)((long)&curlopt.field_2 + 8),typeString);
  std::operator<<(poVar6,(string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::__cxx11::string::~string((string *)&local_e60);
  std::__cxx11::string::~string((string *)&local_e80);
  std::__cxx11::string::~string((string *)&local_df8);
  std::__cxx11::string::~string((string *)&local_e18);
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator(&local_e39);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::__cxx11::string::~string((string *)&local_cf0);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&pos,'&');
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)&pos,local_f00);
  std::__cxx11::string::~string(local_f00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1078);
  poVar6 = std::operator<<((ostream *)local_1078,"fields: ");
  poVar6 = std::operator<<(poVar6,(string *)&pos);
  poVar6 = std::operator<<(poVar6,"\nurl:");
  poVar6 = std::operator<<(poVar6,(string *)local_478);
  poVar6 = std::operator<<(poVar6,"\nfile: ");
  poVar6 = std::operator<<(poVar6,(string *)file);
  std::operator<<(poVar6,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x24e,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)(response.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1078);
  std::__cxx11::string::string((string *)local_10b8);
  i._7_1_ = cmCTestCurl::HttpRequest
                      ((cmCTestCurl *)((long)&curlopt.field_2 + 8),(string *)local_478,
                       (string *)&pos,(string *)local_10b8);
  if (((local_681 & 1) == 0) && (!i._7_1_)) {
    for (local_10c8 = 0; local_10c8 < local_910; local_10c8 = local_10c8 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1240);
      poVar6 = std::operator<<((ostream *)local_1240,"   Request failed, waiting ");
      rVar9 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                        ((duration<long,_std::ratio<1L,_1L>_> *)&retryDelayValue);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,rVar9);
      std::operator<<(poVar6," seconds...\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,600,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&stop);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1240);
      local_1270.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_1268 = std::chrono::operator+
                             (&local_1270,(duration<long,_std::ratio<1L,_1L>_> *)&retryDelayValue);
      while( true ) {
        local_1278.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar3 = std::chrono::operator<(&local_1278,&local_1268);
        if (!bVar3) break;
        cmsys::SystemTools::Delay(100);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13f0);
      poVar6 = std::operator<<((ostream *)local_13f0,"   Retry request: Attempt ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10c8 + 1);
      poVar6 = std::operator<<(poVar6," of ");
      pvVar10 = (void *)std::ostream::operator<<(poVar6,local_910);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x262,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_1410);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13f0);
      i._7_1_ = cmCTestCurl::HttpRequest
                          ((cmCTestCurl *)((long)&curlopt.field_2 + 8),(string *)local_478,
                           (string *)&pos,(string *)local_10b8);
      if (i._7_1_) break;
    }
  }
  if (((local_681 & 1) == 0) && (i._7_1_ == false)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1588);
    poVar6 = std::operator<<((ostream *)local_1588,"Error in HttpRequest\n");
    std::operator<<(poVar6,(string *)local_10b8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x26d,pcVar7,false);
    std::__cxx11::string::~string(local_15a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1588);
    this_local._4_4_ = -1;
    fields.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1720);
    poVar6 = std::operator<<((ostream *)local_1720,"Request upload response: [");
    poVar6 = std::operator<<(poVar6,(string *)local_10b8);
    std::operator<<(poVar6,"]\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x272,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&json.limit_);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1720);
    Json::Value::Value((Value *)&reader.features_,nullValue);
    Json::Reader::Reader((Reader *)local_1878);
    if (((local_681 & 1) != 0) ||
       (bVar3 = Json::Reader::parse((Reader *)local_1878,(string *)local_10b8,
                                    (Value *)&reader.features_,true), bVar3)) {
      if ((local_681 & 1) == 0) {
        pVVar11 = Json::Value::operator[]((Value *)&reader.features_,"status");
        IVar4 = Json::Value::asInt(pVVar11);
        if (IVar4 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ba8);
          poVar6 = std::operator<<((ostream *)local_1ba8,"Bad status returned from CDash: ");
          pVVar11 = Json::Value::operator[]((Value *)&reader.features_,"status");
          IVar4 = Json::Value::asInt(pVVar11);
          std::ostream::operator<<(poVar6,IVar4);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x27e,pcVar7,false);
          std::__cxx11::string::~string(local_1bc8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ba8);
          this_local._4_4_ = -1;
          fields.field_2._12_4_ = 1;
          goto LAB_00285c4f;
        }
      }
      if ((local_681 & 1) == 0) {
        pVVar11 = Json::Value::operator[]((Value *)&reader.features_,"datafilesmd5");
        bVar3 = Json::Value::isArray(pVVar11);
        if (bVar3) {
          pVVar11 = Json::Value::operator[]((Value *)&reader.features_,"datafilesmd5");
          pVVar11 = Json::Value::operator[](pVVar11,0);
          IVar4 = Json::Value::asInt(pVVar11);
          if (IVar4 != 1) goto LAB_0028504c;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d48);
          poVar6 = std::operator<<((ostream *)local_1d48,
                                   "File already exists on CDash, skip upload ");
          poVar6 = std::operator<<(poVar6,(string *)file);
          std::operator<<(poVar6,"\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x288,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1d68);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d48);
          this_local._4_4_ = 0;
          fields.field_2._12_4_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ee0);
          poVar6 = std::operator<<((ostream *)local_1ee0,"bad datafilesmd5 value in response ");
          poVar6 = std::operator<<(poVar6,(string *)local_10b8);
          std::operator<<(poVar6,"\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x28d,pcVar7,false);
          std::__cxx11::string::~string((string *)(upload_as.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ee0);
          this_local._4_4_ = -1;
          fields.field_2._12_4_ = 1;
        }
      }
      else {
LAB_0028504c:
        cmsys::SystemTools::GetFilenameName((string *)local_1f20,file);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2098);
        poVar6 = std::operator<<((ostream *)local_2098,"type=");
        cmCTestCurl::Escape(&local_20b8,(cmCTestCurl *)((long)&curlopt.field_2 + 8),typeString);
        poVar6 = std::operator<<(poVar6,(string *)&local_20b8);
        poVar6 = std::operator<<(poVar6,"&");
        poVar6 = std::operator<<(poVar6,"md5=");
        poVar6 = std::operator<<(poVar6,(string *)&ch);
        poVar6 = std::operator<<(poVar6,"&");
        poVar6 = std::operator<<(poVar6,"filename=");
        cmCTestCurl::Escape(&local_20d8,(cmCTestCurl *)((long)&curlopt.field_2 + 8),
                            (string *)local_1f20);
        poVar6 = std::operator<<(poVar6,(string *)&local_20d8);
        poVar6 = std::operator<<(poVar6,"&");
        poVar6 = std::operator<<(poVar6,"buildid=");
        pVVar11 = Json::Value::operator[]((Value *)&reader.features_,"buildid");
        Json::Value::asString_abi_cxx11_((String *)local_20f8,pVVar11);
        std::operator<<(poVar6,(string *)local_20f8);
        std::__cxx11::string::~string((string *)local_20f8);
        std::__cxx11::string::~string((string *)&local_20d8);
        std::__cxx11::string::~string((string *)&local_20b8);
        local_20f9 = 0;
        if ((local_681 & 1) == 0) {
          std::__cxx11::ostringstream::str();
          local_20f9 = cmCTestCurl::UploadFile
                                 ((cmCTestCurl *)((long)&curlopt.field_2 + 8),file,
                                  (string *)local_478,(string *)&i_1,(string *)local_10b8);
          std::__cxx11::string::~string((string *)&i_1);
        }
        if ((local_20f9 & 1) == 0) {
          for (local_2128 = 0; local_2128 < local_910; local_2128 = local_2128 + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_22a0);
            poVar6 = std::operator<<((ostream *)local_22a0,"   Upload failed, waiting ");
            rVar9 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                              ((duration<long,_std::ratio<1L,_1L>_> *)&retryDelayValue);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,rVar9);
            std::operator<<(poVar6," seconds...\n");
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x2a4,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string((string *)&stop_1);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_22a0);
            local_22d0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
            local_22c8 = std::chrono::operator+
                                   (&local_22d0,
                                    (duration<long,_std::ratio<1L,_1L>_> *)&retryDelayValue);
            while( true ) {
              local_22d8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
              bVar3 = std::chrono::operator<(&local_22d8,&local_22c8);
              if (!bVar3) break;
              cmsys::SystemTools::Delay(100);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2450);
            poVar6 = std::operator<<((ostream *)local_2450,"   Retry upload: Attempt ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2128 + 1);
            poVar6 = std::operator<<(poVar6," of ");
            pvVar10 = (void *)std::ostream::operator<<(poVar6,local_910);
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x2ae,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_2470);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2450);
            if ((local_681 & 1) == 0) {
              std::__cxx11::ostringstream::str();
              local_20f9 = cmCTestCurl::UploadFile
                                     ((cmCTestCurl *)((long)&curlopt.field_2 + 8),file,
                                      (string *)local_478,&local_2490,(string *)local_10b8);
              std::__cxx11::string::~string((string *)&local_2490);
            }
            if ((local_20f9 & 1) != 0) break;
          }
        }
        if ((local_20f9 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2608);
          poVar6 = std::operator<<((ostream *)local_2608,"error uploading to CDash. ");
          poVar6 = std::operator<<(poVar6,(string *)file);
          poVar6 = std::operator<<(poVar6," ");
          poVar6 = std::operator<<(poVar6,(string *)local_478);
          poVar6 = std::operator<<(poVar6," ");
          std::__cxx11::ostringstream::str();
          std::operator<<(poVar6,local_2628);
          std::__cxx11::string::~string(local_2628);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,700,pcVar7,false);
          std::__cxx11::string::~string(local_2648);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2608);
          this_local._4_4_ = -1;
        }
        else {
          bVar3 = Json::Reader::parse((Reader *)local_1878,(string *)local_10b8,
                                      (Value *)&reader.features_,true);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2978);
            poVar6 = std::operator<<((ostream *)local_2978,"Upload file response: [");
            poVar6 = std::operator<<(poVar6,(string *)local_10b8);
            std::operator<<(poVar6,"]\n");
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x2c8,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_2998);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2978);
            this_local._4_4_ = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_27c0);
            poVar6 = std::operator<<((ostream *)local_27c0,"error parsing json string [");
            poVar6 = std::operator<<(poVar6,(string *)local_10b8);
            poVar6 = std::operator<<(poVar6,"]\n");
            Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_27e0,(Reader *)local_1878);
            poVar6 = std::operator<<(poVar6,(string *)&local_27e0);
            std::operator<<(poVar6,"\n");
            std::__cxx11::string::~string((string *)&local_27e0);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x2c3,pcVar7,false);
            std::__cxx11::string::~string(local_2800);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_27c0);
            this_local._4_4_ = -1;
          }
        }
        fields.field_2._12_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2098);
        std::__cxx11::string::~string((string *)local_1f20);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19f0);
      poVar6 = std::operator<<((ostream *)local_19f0,"error parsing json string [");
      poVar6 = std::operator<<(poVar6,(string *)local_10b8);
      poVar6 = std::operator<<(poVar6,"]\n");
      Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_1a10,(Reader *)local_1878);
      poVar6 = std::operator<<(poVar6,(string *)&local_1a10);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_1a10);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x279,pcVar7,false);
      std::__cxx11::string::~string(local_1a30);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19f0);
      this_local._4_4_ = -1;
      fields.field_2._12_4_ = 1;
    }
LAB_00285c4f:
    Json::Reader::~Reader((Reader *)local_1878);
    Json::Value::~Value((Value *)&reader.features_);
  }
  std::__cxx11::string::~string((string *)local_10b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c80);
  std::__cxx11::string::~string((string *)&ch);
  std::__cxx11::string::~string((string *)local_728);
  std::__cxx11::string::~string((string *)local_6d8);
  std::__cxx11::string::~string((string *)&pos);
LAB_00285d17:
  std::__cxx11::string::~string((string *)local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_440);
  std::__cxx11::string::~string((string *)local_400);
  cmCTestCurl::~cmCTestCurl((cmCTestCurl *)((long)&curlopt.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

int cmCTestSubmitHandler::HandleCDashUploadFile(std::string const& file,
                                                std::string const& typeString)
{
  if (file.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Upload file not specified\n");
    return -1;
  }
  if (!cmSystemTools::FileExists(file)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Upload file not found: '" << file << "'\n");
    return -1;
  }
  cmCTestCurl curl(this->CTest);
  curl.SetQuiet(this->Quiet);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args = cmExpandedList(curlopt);
  curl.SetCurlOptions(args);
  auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
  if (submitInactivityTimeout != 0) {
    curl.SetTimeOutSeconds(submitInactivityTimeout);
  }
  curl.SetHttpHeaders(this->HttpHeaders);
  std::string url = this->CTest->GetSubmitURL();
  if (!cmHasLiteralPrefix(url, "http://") &&
      !cmHasLiteralPrefix(url, "https://")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Only http and https are supported for CDASH_UPLOAD\n");
    return -1;
  }

  std::string fields;
  std::string::size_type pos = url.find('?');
  if (pos != std::string::npos) {
    fields = url.substr(pos + 1);
    url.erase(pos);
  }
  bool internalTest = cmIsOn(this->GetOption("InternalTest"));

  // Get RETRY_COUNT and RETRY_DELAY values if they were set.
  std::string retryDelayString = *this->GetOption("RetryDelay");
  std::string retryCountString = *this->GetOption("RetryCount");
  auto retryDelay = std::chrono::seconds(0);
  if (!retryDelayString.empty()) {
    unsigned long retryDelayValue = 0;
    if (!cmStrToULong(retryDelayString, &retryDelayValue)) {
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'RETRY_DELAY' : " << retryDelayString
                                                      << std::endl);
    } else {
      retryDelay = std::chrono::seconds(retryDelayValue);
    }
  }
  unsigned long retryCount = 0;
  if (!retryCountString.empty()) {
    if (!cmStrToULong(retryCountString, &retryCount)) {
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'RETRY_DELAY' : " << retryCountString
                                                      << std::endl);
    }
  }

  std::string md5sum =
    cmSystemTools::ComputeFileHash(file, cmCryptoHash::AlgoMD5);
  // 1. request the buildid and check to see if the file
  //    has already been uploaded
  // TODO I added support for subproject. You would need to add
  // a "&subproject=subprojectname" to the first POST.
  cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
  cmake* cm = ch->GetCMake();
  cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
  // TODO: Encode values for a URL instead of trusting caller.
  std::ostringstream str;
  if (subproject) {
    str << "subproject=" << curl.Escape(*subproject) << "&";
  }
  auto timeNow =
    std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
  str << "stamp=" << curl.Escape(this->CTest->GetCurrentTag()) << "-"
      << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "model=" << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "build="
      << curl.Escape(this->CTest->GetCTestConfiguration("BuildName")) << "&"
      << "site=" << curl.Escape(this->CTest->GetCTestConfiguration("Site"))
      << "&"
      << "group=" << curl.Escape(this->CTest->GetTestModelString())
      << "&"
      // For now, we send both "track" and "group" to CDash in case we're
      // submitting to an older instance that still expects the prior
      // terminology.
      << "track=" << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "starttime=" << timeNow << "&"
      << "endtime=" << timeNow << "&"
      << "datafilesmd5[0]=" << md5sum << "&"
      << "type=" << curl.Escape(typeString);
  if (!fields.empty()) {
    fields += '&';
  }
  fields += str.str();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "fields: " << fields << "\nurl:" << url
                                << "\nfile: " << file << "\n",
                     this->Quiet);
  std::string response;

  bool requestSucceeded = curl.HttpRequest(url, fields, response);
  if (!internalTest && !requestSucceeded) {
    // If request failed, wait and retry.
    for (unsigned long i = 0; i < retryCount; i++) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Request failed, waiting " << retryDelay.count()
                                                       << " seconds...\n",
                         this->Quiet);

      auto stop = std::chrono::steady_clock::now() + retryDelay;
      while (std::chrono::steady_clock::now() < stop) {
        cmSystemTools::Delay(100);
      }

      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Retry request: Attempt "
                           << (i + 1) << " of " << retryCount << std::endl,
                         this->Quiet);

      requestSucceeded = curl.HttpRequest(url, fields, response);
      if (requestSucceeded) {
        break;
      }
    }
  }
  if (!internalTest && !requestSucceeded) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error in HttpRequest\n"
                 << response);
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Request upload response: [" << response << "]\n",
                     this->Quiet);
  Json::Value json;
  Json::Reader reader;
  if (!internalTest && !reader.parse(response, json)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error parsing json string ["
                 << response << "]\n"
                 << reader.getFormattedErrorMessages() << "\n");
    return -1;
  }
  if (!internalTest && json["status"].asInt() != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad status returned from CDash: " << json["status"].asInt());
    return -1;
  }
  if (!internalTest) {
    if (json["datafilesmd5"].isArray()) {
      int datares = json["datafilesmd5"][0].asInt();
      if (datares == 1) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "File already exists on CDash, skip upload "
                             << file << "\n",
                           this->Quiet);
        return 0;
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "bad datafilesmd5 value in response " << response << "\n");
      return -1;
    }
  }

  std::string upload_as = cmSystemTools::GetFilenameName(file);
  std::ostringstream fstr;
  fstr << "type=" << curl.Escape(typeString) << "&"
       << "md5=" << md5sum << "&"
       << "filename=" << curl.Escape(upload_as) << "&"
       << "buildid=" << json["buildid"].asString();

  bool uploadSucceeded = false;
  if (!internalTest) {
    uploadSucceeded = curl.UploadFile(file, url, fstr.str(), response);
  }

  if (!uploadSucceeded) {
    // If upload failed, wait and retry.
    for (unsigned long i = 0; i < retryCount; i++) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Upload failed, waiting " << retryDelay.count()
                                                      << " seconds...\n",
                         this->Quiet);

      auto stop = std::chrono::steady_clock::now() + retryDelay;
      while (std::chrono::steady_clock::now() < stop) {
        cmSystemTools::Delay(100);
      }

      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Retry upload: Attempt "
                           << (i + 1) << " of " << retryCount << std::endl,
                         this->Quiet);

      if (!internalTest) {
        uploadSucceeded = curl.UploadFile(file, url, fstr.str(), response);
      }
      if (uploadSucceeded) {
        break;
      }
    }
  }

  if (!uploadSucceeded) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error uploading to CDash. " << file << " " << url << " "
                                            << fstr.str());
    return -1;
  }
  if (!reader.parse(response, json)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error parsing json string ["
                 << response << "]\n"
                 << reader.getFormattedErrorMessages() << "\n");
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Upload file response: [" << response << "]\n",
                     this->Quiet);
  return 0;
}